

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * Bstrlib::operator+(CBString *__return_storage_ptr__,char c,CBString *b)

{
  CBString local_38;
  CBString *local_20;
  CBString *b_local;
  CBString *pCStack_10;
  char c_local;
  
  local_20 = b;
  b_local._7_1_ = c;
  pCStack_10 = __return_storage_ptr__;
  CBString::CBString(&local_38,c);
  CBString::operator+(__return_storage_ptr__,&local_38,local_20);
  CBString::~CBString(&local_38);
  return __return_storage_ptr__;
}

Assistant:

const CBString operator + (char c, const CBString& b) {
	return CBString(c) + b;
}